

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O0

int check(char *a)

{
  int iVar1;
  char *pcStack_18;
  uint pid;
  char *a_local;
  
  r = svstatus_get();
  pcStack_18 = a;
  if (r == -1) {
    a_local._4_4_ = -1;
  }
  else {
    for (; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
      if (r == 0) {
        if (*pcStack_18 == 'x') {
          return 1;
        }
        return -1;
      }
      iVar1 = (((uint)(byte)svstatus[0xf] * 0x100 + (uint)(byte)svstatus[0xe]) * 0x100 +
              (uint)(byte)svstatus[0xd]) * 0x100 + (uint)(byte)svstatus[0xc];
      switch(*pcStack_18) {
      case 'C':
        if ((iVar1 != 0) && (iVar1 = checkscript(), iVar1 == 0)) {
          return 0;
        }
        break;
      case 'c':
        if ((iVar1 != 0) && (svstatus[0x10] != '\0')) {
          return 0;
        }
        break;
      case 'd':
        if ((iVar1 != 0) || (svstatus[0x13] != '\0')) {
          return 0;
        }
        break;
      case 'k':
      case 't':
        if (((iVar1 != 0) || (svstatus[0x11] != 'd')) &&
           ((tai_unpack(svstatus,&tstatus), tstatus.x < tstart.sec.x ||
            (((iVar1 == 0 || (svstatus[0x12] != '\0')) || (iVar1 = checkscript(), iVar1 == 0)))))) {
          return 0;
        }
        break;
      case 'o':
        tai_unpack(svstatus,&tstatus);
        if (((iVar1 == 0) && (tstatus.x < tstart.sec.x)) ||
           ((iVar1 != 0 && (svstatus[0x11] != 'd')))) {
          return 0;
        }
        break;
      case 'p':
        if ((iVar1 != 0) && (svstatus[0x10] == '\0')) {
          return 0;
        }
        break;
      case 'u':
        if ((iVar1 == 0) || (svstatus[0x13] != '\x01')) {
          return 0;
        }
        iVar1 = checkscript();
        if (iVar1 == 0) {
          return 0;
        }
        break;
      case 'x':
        return 0;
      }
    }
    outs("ok: ");
    svstatus_print(*service);
    flush("\n");
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

int check(char *a) {
  unsigned int pid;

  if ((r =svstatus_get()) == -1) return(-1);
  while (*a) {
    if (r == 0) { if (*a == 'x') return(1); return(-1); }
    pid =(unsigned char)svstatus[15];
    pid <<=8; pid +=(unsigned char)svstatus[14];
    pid <<=8; pid +=(unsigned char)svstatus[13];
    pid <<=8; pid +=(unsigned char)svstatus[12];
    switch (*a) {
    case 'x': return(0);
    case 'u':
      if (!pid || svstatus[19] != 1) return(0);
      if (!checkscript()) return(0);
      break;
    case 'd': if (pid || svstatus[19] != 0) return(0); break;
    case 'C': if (pid) if (!checkscript()) return(0); break;
    case 't':
    case 'k':
      if (!pid && svstatus[17] == 'd') break;
      tai_unpack(svstatus, &tstatus);
      if ((tstart.sec.x > tstatus.x) || !pid || svstatus[18] || !checkscript())
        return(0);
      break;
    case 'o':
      tai_unpack(svstatus, &tstatus);
      if ((!pid && tstart.sec.x > tstatus.x) || (pid && svstatus[17] != 'd'))
        return(0);
      break;
    case 'p': if (pid && !svstatus[16]) return(0); break;
    case 'c': if (pid && svstatus[16]) return(0); break;
    }
    ++a;
  }
  outs(OK); svstatus_print(*service); flush("\n");
  return(1);
}